

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::CheckQuestRules(Character *this)

{
  Quest_Context *this_00;
  _Base_ptr this_01;
  bool bVar1;
  Quest *this_02;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->quests)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this_00 = (Quest_Context *)p_Var2[1]._M_parent;
    this_01 = p_Var2[1]._M_left;
    if (this_01 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
      }
    }
    if (this_00 != (Quest_Context *)0x0) {
      this_02 = Quest_Context::GetQuest(this_00);
      bVar1 = Quest::Disabled(this_02);
      if (!bVar1) {
        EOPlus::Context::CheckRules((Context *)this_00);
      }
    }
    if (this_01 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
  }
  return;
}

Assistant:

void Character::CheckQuestRules()
{
	UTIL_FOREACH(this->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->CheckRules();
	}
}